

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

vector<cmsys::String,_std::allocator<cmsys::String>_> *
cmsys::SystemTools::SplitString
          (vector<cmsys::String,_std::allocator<cmsys::String>_> *__return_storage_ptr__,string *p,
          char sep,bool isPath)

{
  long lVar1;
  String local_90;
  string path;
  string local_50 [32];
  
  std::__cxx11::string::string((string *)&path,(string *)p);
  (__return_storage_ptr__->super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (path._M_string_length != 0) {
    if ((isPath) && (*path._M_dataplus._M_p == '/')) {
      std::__cxx11::string::erase(&path);
      String::String(&local_90,"/");
      std::vector<cmsys::String,_std::allocator<cmsys::String>_>::emplace_back<cmsys::String>
                (__return_storage_ptr__,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
    while( true ) {
      lVar1 = std::__cxx11::string::find((char)&path,(ulong)(uint)(int)sep);
      if (lVar1 == -1) break;
      std::__cxx11::string::substr((ulong)local_50,(ulong)&path);
      std::__cxx11::string::string((string *)&local_90,local_50,0,0xffffffffffffffff);
      std::vector<cmsys::String,_std::allocator<cmsys::String>_>::emplace_back<cmsys::String>
                (__return_storage_ptr__,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string(local_50);
    }
    std::__cxx11::string::substr((ulong)local_50,(ulong)&path);
    std::__cxx11::string::string((string *)&local_90,local_50,0,0xffffffffffffffff);
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::emplace_back<cmsys::String>
              (__return_storage_ptr__,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string(local_50);
  }
  std::__cxx11::string::~string((string *)&path);
  return __return_storage_ptr__;
}

Assistant:

std::vector<kwsys::String> SystemTools::SplitString(const std::string& p, char sep, bool isPath)
{
  std::string path = p;
  std::vector<kwsys::String> paths;
  if(path.empty())
    {
    return paths;
    }
  if(isPath && path[0] == '/')
    {
    path.erase(path.begin());
    paths.push_back("/");
    }
  std::string::size_type pos1 = 0;
  std::string::size_type pos2 = path.find(sep, pos1+1);
  while(pos2 != std::string::npos)
    {
    paths.push_back(path.substr(pos1, pos2-pos1));
    pos1 = pos2+1;
    pos2 = path.find(sep, pos1+1);
    }
  paths.push_back(path.substr(pos1, pos2-pos1));

  return paths;
}